

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O3

void ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>
               (agge_vector<float> *expected,agge_vector<float> *actual,LocationInfo *location)

{
  float fVar1;
  float fVar2;
  FailedAssertion *this;
  string local_40;
  
  fVar1 = expected->dx;
  fVar2 = actual->dx;
  if (((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) ||
     (ABS((fVar1 - fVar2) / (fVar1 + fVar2)) <= 2e-05)) {
    fVar1 = expected->dy;
    fVar2 = actual->dy;
    if (((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) ||
       (ABS((fVar1 - fVar2) / (fVar1 + fVar2)) <= 2e-05)) {
      return;
    }
  }
  this = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
  FailedAssertion::FailedAssertion(this,&local_40,location);
  __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(const T1 &expected, const T2 &actual, const LocationInfo &location)
	{
		if (!(expected == actual))
			throw FailedAssertion("Values are not equal!", location);
	}